

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3WhereExplainBloomFilter(Parse *pParse,WhereInfo *pWInfo,WhereLevel *pLevel)

{
  byte bVar1;
  short sVar2;
  Vdbe *p;
  WhereLoop *pWVar3;
  Index *pIVar4;
  long lVar5;
  int addr;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  long in_FS_OFFSET;
  char zBuf [100];
  StrAccum local_c8;
  char local_a8 [112];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = pLevel->iFrom;
  local_c8.db = pParse->db;
  p = pParse->pVdbe;
  local_c8.zText = local_a8;
  local_a8[0x50] = -0x56;
  local_a8[0x51] = -0x56;
  local_a8[0x52] = -0x56;
  local_a8[0x53] = -0x56;
  local_a8[0x54] = -0x56;
  local_a8[0x55] = -0x56;
  local_a8[0x56] = -0x56;
  local_a8[0x57] = -0x56;
  local_a8[0x58] = -0x56;
  local_a8[0x59] = -0x56;
  local_a8[0x5a] = -0x56;
  local_a8[0x5b] = -0x56;
  local_a8[0x5c] = -0x56;
  local_a8[0x5d] = -0x56;
  local_a8[0x5e] = -0x56;
  local_a8[0x5f] = -0x56;
  local_a8[0x40] = -0x56;
  local_a8[0x41] = -0x56;
  local_a8[0x42] = -0x56;
  local_a8[0x43] = -0x56;
  local_a8[0x44] = -0x56;
  local_a8[0x45] = -0x56;
  local_a8[0x46] = -0x56;
  local_a8[0x47] = -0x56;
  local_a8[0x48] = -0x56;
  local_a8[0x49] = -0x56;
  local_a8[0x4a] = -0x56;
  local_a8[0x4b] = -0x56;
  local_a8[0x4c] = -0x56;
  local_a8[0x4d] = -0x56;
  local_a8[0x4e] = -0x56;
  local_a8[0x4f] = -0x56;
  local_a8[0x30] = -0x56;
  local_a8[0x31] = -0x56;
  local_a8[0x32] = -0x56;
  local_a8[0x33] = -0x56;
  local_a8[0x34] = -0x56;
  local_a8[0x35] = -0x56;
  local_a8[0x36] = -0x56;
  local_a8[0x37] = -0x56;
  local_a8[0x38] = -0x56;
  local_a8[0x39] = -0x56;
  local_a8[0x3a] = -0x56;
  local_a8[0x3b] = -0x56;
  local_a8[0x3c] = -0x56;
  local_a8[0x3d] = -0x56;
  local_a8[0x3e] = -0x56;
  local_a8[0x3f] = -0x56;
  local_a8[0x20] = -0x56;
  local_a8[0x21] = -0x56;
  local_a8[0x22] = -0x56;
  local_a8[0x23] = -0x56;
  local_a8[0x24] = -0x56;
  local_a8[0x25] = -0x56;
  local_a8[0x26] = -0x56;
  local_a8[0x27] = -0x56;
  local_a8[0x28] = -0x56;
  local_a8[0x29] = -0x56;
  local_a8[0x2a] = -0x56;
  local_a8[0x2b] = -0x56;
  local_a8[0x2c] = -0x56;
  local_a8[0x2d] = -0x56;
  local_a8[0x2e] = -0x56;
  local_a8[0x2f] = -0x56;
  local_a8[0x10] = -0x56;
  local_a8[0x11] = -0x56;
  local_a8[0x12] = -0x56;
  local_a8[0x13] = -0x56;
  local_a8[0x14] = -0x56;
  local_a8[0x15] = -0x56;
  local_a8[0x16] = -0x56;
  local_a8[0x17] = -0x56;
  local_a8[0x18] = -0x56;
  local_a8[0x19] = -0x56;
  local_a8[0x1a] = -0x56;
  local_a8[0x1b] = -0x56;
  local_a8[0x1c] = -0x56;
  local_a8[0x1d] = -0x56;
  local_a8[0x1e] = -0x56;
  local_a8[0x1f] = -0x56;
  local_a8[0] = -0x56;
  local_a8[1] = -0x56;
  local_a8[2] = -0x56;
  local_a8[3] = -0x56;
  local_a8[4] = -0x56;
  local_a8[5] = -0x56;
  local_a8[6] = -0x56;
  local_a8[7] = -0x56;
  local_a8[8] = -0x56;
  local_a8[9] = -0x56;
  local_a8[10] = -0x56;
  local_a8[0xb] = -0x56;
  local_a8[0xc] = -0x56;
  local_a8[0xd] = -0x56;
  local_a8[0xe] = -0x56;
  local_a8[0xf] = -0x56;
  local_a8[0x60] = -0x56;
  local_a8[0x61] = -0x56;
  local_a8[0x62] = -0x56;
  local_a8[99] = -0x56;
  local_c8.nAlloc = 100;
  local_c8.mxAlloc = 1000000000;
  local_c8.nChar = 0;
  local_c8.accError = '\0';
  local_c8.printfFlags = '\x01';
  local_c8._30_2_ = 0xaaaa;
  sqlite3_str_appendf(&local_c8,"BLOOM FILTER ON %S (",
                      pWInfo->aiCurOnePass + (ulong)bVar1 * 0x12 + -8);
  pWVar3 = pLevel->pWLoop;
  if ((pWVar3->wsFlags & 0x100) == 0) {
    uVar8 = (ulong)pWVar3->nSkip;
    if (pWVar3->nSkip < (pWVar3->u).btree.nEq) {
      do {
        pIVar4 = (pWVar3->u).btree.pIndex;
        sVar2 = pIVar4->aiColumn[uVar8];
        pcVar9 = "<expr>";
        if (sVar2 != -2) {
          if (sVar2 == -1) {
            pcVar9 = "rowid";
          }
          else {
            pcVar9 = pIVar4->pTable->aCol[sVar2].zCnName;
          }
        }
        if (pWVar3->nSkip < uVar8) {
          uVar6 = local_c8._24_8_ & 0xffffffff;
          if (local_c8.nChar + 5 < local_c8.nAlloc) {
            local_c8.nChar = local_c8.nChar + 5;
            builtin_strncpy(local_c8.zText + uVar6," AND ",5);
          }
          else {
            enlargeAndAppend(&local_c8," AND ",5);
          }
        }
        sqlite3_str_appendf(&local_c8,"%s=?",pcVar9);
        uVar8 = uVar8 + 1;
      } while (uVar8 < (pWVar3->u).btree.nEq);
    }
  }
  else {
    lVar5 = *(long *)(pWInfo->aiCurOnePass + (ulong)bVar1 * 0x12 + -8 + 4);
    lVar7 = (long)*(short *)(lVar5 + 0x34);
    if (lVar7 < 0) {
      sqlite3_str_appendf(&local_c8,"rowid=?");
    }
    else {
      sqlite3_str_appendf(&local_c8,"%s=?",*(undefined8 *)(*(long *)(lVar5 + 8) + lVar7 * 0x10));
    }
  }
  uVar8 = local_c8._24_8_ & 0xffffffff;
  if (local_c8.nChar + 1 < local_c8.nAlloc) {
    local_c8.nChar = local_c8.nChar + 1;
    local_c8.zText[uVar8] = ')';
  }
  else {
    enlargeAndAppend(&local_c8,")",1);
  }
  pcVar9 = sqlite3StrAccumFinish(&local_c8);
  addr = sqlite3VdbeAddOp3(p,0xbc,p->nOp,pParse->addrExplain,0);
  sqlite3VdbeChangeP4(p,addr,pcVar9,-6);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

SQLITE_PRIVATE int sqlite3WhereExplainBloomFilter(
  const Parse *pParse,               /* Parse context */
  const WhereInfo *pWInfo,           /* WHERE clause */
  const WhereLevel *pLevel           /* Bloom filter on this level */
){
  int ret = 0;
  SrcItem *pItem = &pWInfo->pTabList->a[pLevel->iFrom];
  Vdbe *v = pParse->pVdbe;      /* VM being constructed */
  sqlite3 *db = pParse->db;     /* Database handle */
  char *zMsg;                   /* Text to add to EQP output */
  int i;                        /* Loop counter */
  WhereLoop *pLoop;             /* The where loop */
  StrAccum str;                 /* EQP output string */
  char zBuf[100];               /* Initial space for EQP output string */

  sqlite3StrAccumInit(&str, db, zBuf, sizeof(zBuf), SQLITE_MAX_LENGTH);
  str.printfFlags = SQLITE_PRINTF_INTERNAL;
  sqlite3_str_appendf(&str, "BLOOM FILTER ON %S (", pItem);
  pLoop = pLevel->pWLoop;
  if( pLoop->wsFlags & WHERE_IPK ){
    const Table *pTab = pItem->pSTab;
    if( pTab->iPKey>=0 ){
      sqlite3_str_appendf(&str, "%s=?", pTab->aCol[pTab->iPKey].zCnName);
    }else{
      sqlite3_str_appendf(&str, "rowid=?");
    }
  }else{
    for(i=pLoop->nSkip; i<pLoop->u.btree.nEq; i++){
      const char *z = explainIndexColumnName(pLoop->u.btree.pIndex, i);
      if( i>pLoop->nSkip ) sqlite3_str_append(&str, " AND ", 5);
      sqlite3_str_appendf(&str, "%s=?", z);
    }
  }
  sqlite3_str_append(&str, ")", 1);
  zMsg = sqlite3StrAccumFinish(&str);
  ret = sqlite3VdbeAddOp4(v, OP_Explain, sqlite3VdbeCurrentAddr(v),
                          pParse->addrExplain, 0, zMsg,P4_DYNAMIC);

  sqlite3VdbeScanStatus(v, sqlite3VdbeCurrentAddr(v)-1, 0, 0, 0, 0);
  return ret;
}